

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 (*pauVar25) [16];
  undefined4 uVar26;
  float *vertices;
  undefined1 (*pauVar27) [16];
  AABBNodeMB4D *node1;
  ulong uVar29;
  long lVar30;
  RTCRayQueryContext *pRVar31;
  uint uVar32;
  int *piVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar55;
  float fVar56;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  float fVar71;
  float fVar81;
  float fVar82;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar83;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  float fVar94;
  float fVar95;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  undefined1 auVar112 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar119;
  uint uVar120;
  float fVar121;
  uint uVar122;
  float fVar123;
  uint uVar124;
  undefined1 auVar118 [64];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1228;
  undefined8 uStack_1220;
  int local_11fc;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  RayQueryContext *local_11b0;
  Scene *local_11a8;
  long local_11a0;
  RTCFilterFunctionNArguments local_1198;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  ulong local_1158;
  long local_1150;
  ulong local_1148;
  ulong local_1140;
  undefined4 local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  float local_112c;
  float local_1128;
  undefined4 local_1124;
  uint local_1120;
  uint local_111c;
  uint local_1118;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_1098 [16];
  float local_1088 [4];
  float local_1078 [4];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar28;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_11b0 = context;
    pauVar27 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar72 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar46 = (ray->super_RayK<1>).tfar;
    auVar70 = ZEXT464((uint)fVar46);
    auVar58 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar46));
    auVar90._8_4_ = 0x7fffffff;
    auVar90._0_8_ = 0x7fffffff7fffffff;
    auVar90._12_4_ = 0x7fffffff;
    auVar90 = vandps_avx((undefined1  [16])aVar4,auVar90);
    auVar104._8_4_ = 0x219392ef;
    auVar104._0_8_ = 0x219392ef219392ef;
    auVar104._12_4_ = 0x219392ef;
    auVar90 = vcmpps_avx(auVar90,auVar104,1);
    auVar90 = vblendvps_avx((undefined1  [16])aVar4,auVar104,auVar90);
    auVar104 = vrcpps_avx(auVar90);
    fVar46 = auVar104._0_4_;
    auVar85._0_4_ = auVar90._0_4_ * fVar46;
    fVar55 = auVar104._4_4_;
    auVar85._4_4_ = auVar90._4_4_ * fVar55;
    fVar56 = auVar104._8_4_;
    auVar85._8_4_ = auVar90._8_4_ * fVar56;
    fVar57 = auVar104._12_4_;
    auVar85._12_4_ = auVar90._12_4_ * fVar57;
    auVar105._8_4_ = 0x3f800000;
    auVar105._0_8_ = 0x3f8000003f800000;
    auVar105._12_4_ = 0x3f800000;
    auVar90 = vsubps_avx(auVar105,auVar85);
    auVar86._0_4_ = fVar46 + fVar46 * auVar90._0_4_;
    auVar86._4_4_ = fVar55 + fVar55 * auVar90._4_4_;
    auVar86._8_4_ = fVar56 + fVar56 * auVar90._8_4_;
    auVar86._12_4_ = fVar57 + fVar57 * auVar90._12_4_;
    uVar26 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_fc8._4_4_ = uVar26;
    local_fc8._0_4_ = uVar26;
    local_fc8._8_4_ = uVar26;
    local_fc8._12_4_ = uVar26;
    auVar112 = ZEXT1664(local_fc8);
    uVar26 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_fd8._4_4_ = uVar26;
    local_fd8._0_4_ = uVar26;
    local_fd8._8_4_ = uVar26;
    local_fd8._12_4_ = uVar26;
    auVar116 = ZEXT1664(local_fd8);
    uVar26 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_fe8._4_4_ = uVar26;
    local_fe8._0_4_ = uVar26;
    local_fe8._8_4_ = uVar26;
    local_fe8._12_4_ = uVar26;
    auVar118 = ZEXT1664(local_fe8);
    local_ff8 = vshufps_avx(auVar86,auVar86,0);
    auVar126 = ZEXT1664(local_ff8);
    auVar90 = vmovshdup_avx(auVar86);
    local_1008 = vshufps_avx(auVar86,auVar86,0x55);
    auVar131 = ZEXT1664(local_1008);
    auVar104 = vshufpd_avx(auVar86,auVar86,1);
    uVar28 = (ulong)(auVar86._0_4_ < 0.0) << 4;
    local_1018 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar133 = ZEXT1664(local_1018);
    uVar41 = (ulong)(auVar90._0_4_ < 0.0) << 4 | 0x20;
    uVar45 = (ulong)(auVar104._0_4_ < 0.0) << 4 | 0x40;
    uVar44 = uVar28 ^ 0x10;
    local_1028 = vshufps_avx(auVar72,auVar72,0);
    auVar134 = ZEXT1664(local_1028);
    auVar90 = vshufps_avx(auVar58,auVar58,0);
    auVar54 = ZEXT1664(auVar90);
    local_1108 = mm_lookupmask_ps._240_8_;
    uStack_1100 = mm_lookupmask_ps._248_8_;
    local_1158 = uVar28;
LAB_011d9fc0:
    do {
      pauVar25 = pauVar27 + -1;
      pauVar27 = pauVar27 + -1;
      if (*(float *)(*pauVar25 + 8) <= auVar70._0_4_) {
        uVar34 = *(ulong *)*pauVar27;
        while ((uVar34 & 8) == 0) {
          uVar29 = uVar34 & 0xfffffffffffffff0;
          fVar46 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar58._4_4_ = fVar46;
          auVar58._0_4_ = fVar46;
          auVar58._8_4_ = fVar46;
          auVar58._12_4_ = fVar46;
          pfVar3 = (float *)(uVar29 + 0x80 + uVar28);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar28);
          auVar72._0_4_ = fVar46 * *pfVar3 + *pfVar1;
          auVar72._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
          auVar72._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
          auVar72._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
          auVar90 = vsubps_avx(auVar72,auVar112._0_16_);
          auVar73._0_4_ = auVar126._0_4_ * auVar90._0_4_;
          auVar73._4_4_ = auVar126._4_4_ * auVar90._4_4_;
          auVar73._8_4_ = auVar126._8_4_ * auVar90._8_4_;
          auVar73._12_4_ = auVar126._12_4_ * auVar90._12_4_;
          pfVar3 = (float *)(uVar29 + 0x80 + uVar41);
          auVar90 = vmaxps_avx(auVar134._0_16_,auVar73);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar41);
          auVar87._0_4_ = fVar46 * *pfVar3 + *pfVar1;
          auVar87._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
          auVar87._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
          auVar87._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
          auVar72 = vsubps_avx(auVar87,auVar116._0_16_);
          pfVar3 = (float *)(uVar29 + 0x80 + uVar45);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar45);
          auVar97._0_4_ = fVar46 * *pfVar3 + *pfVar1;
          auVar97._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
          auVar97._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
          auVar97._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
          auVar88._0_4_ = auVar131._0_4_ * auVar72._0_4_;
          auVar88._4_4_ = auVar131._4_4_ * auVar72._4_4_;
          auVar88._8_4_ = auVar131._8_4_ * auVar72._8_4_;
          auVar88._12_4_ = auVar131._12_4_ * auVar72._12_4_;
          auVar72 = vsubps_avx(auVar97,auVar118._0_16_);
          auVar98._0_4_ = auVar133._0_4_ * auVar72._0_4_;
          auVar98._4_4_ = auVar133._4_4_ * auVar72._4_4_;
          auVar98._8_4_ = auVar133._8_4_ * auVar72._8_4_;
          auVar98._12_4_ = auVar133._12_4_ * auVar72._12_4_;
          auVar72 = vmaxps_avx(auVar88,auVar98);
          pfVar3 = (float *)(uVar29 + 0x80 + uVar44);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar44);
          auVar99._0_4_ = fVar46 * *pfVar3 + *pfVar1;
          auVar99._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
          auVar99._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
          auVar99._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
          local_10e8 = vmaxps_avx(auVar90,auVar72);
          auVar90 = vsubps_avx(auVar99,auVar112._0_16_);
          pfVar3 = (float *)(uVar29 + 0x80 + (uVar41 ^ 0x10));
          auVar89._0_4_ = auVar126._0_4_ * auVar90._0_4_;
          auVar89._4_4_ = auVar126._4_4_ * auVar90._4_4_;
          auVar89._8_4_ = auVar126._8_4_ * auVar90._8_4_;
          auVar89._12_4_ = auVar126._12_4_ * auVar90._12_4_;
          pfVar1 = (float *)(uVar29 + 0x20 + (uVar41 ^ 0x10));
          auVar100._0_4_ = fVar46 * *pfVar3 + *pfVar1;
          auVar100._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
          auVar100._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
          auVar100._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
          auVar90 = vsubps_avx(auVar100,auVar116._0_16_);
          pfVar3 = (float *)(uVar29 + 0x80 + (uVar45 ^ 0x10));
          pfVar1 = (float *)(uVar29 + 0x20 + (uVar45 ^ 0x10));
          auVar106._0_4_ = fVar46 * *pfVar3 + *pfVar1;
          auVar106._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
          auVar106._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
          auVar106._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
          auVar101._0_4_ = auVar131._0_4_ * auVar90._0_4_;
          auVar101._4_4_ = auVar131._4_4_ * auVar90._4_4_;
          auVar101._8_4_ = auVar131._8_4_ * auVar90._8_4_;
          auVar101._12_4_ = auVar131._12_4_ * auVar90._12_4_;
          auVar90 = vsubps_avx(auVar106,auVar118._0_16_);
          auVar107._0_4_ = auVar133._0_4_ * auVar90._0_4_;
          auVar107._4_4_ = auVar133._4_4_ * auVar90._4_4_;
          auVar107._8_4_ = auVar133._8_4_ * auVar90._8_4_;
          auVar107._12_4_ = auVar133._12_4_ * auVar90._12_4_;
          auVar90 = vminps_avx(auVar101,auVar107);
          auVar72 = vminps_avx(auVar54._0_16_,auVar89);
          auVar90 = vminps_avx(auVar72,auVar90);
          auVar90 = vcmpps_avx(local_10e8,auVar90,2);
          if (((uint)uVar34 & 7) == 6) {
            auVar72 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0xe0),auVar58,2);
            auVar58 = vcmpps_avx(auVar58,*(undefined1 (*) [16])(uVar29 + 0xf0),1);
            auVar72 = vandps_avx(auVar72,auVar58);
            auVar90 = vandps_avx(auVar72,auVar90);
          }
          auVar90 = vpslld_avx(auVar90,0x1f);
          uVar32 = vmovmskps_avx(auVar90);
          if (uVar32 == 0) {
            auVar90 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar70 = ZEXT1664(auVar90);
            if (pauVar27 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_011d9fc0;
          }
          uVar32 = uVar32 & 0xff;
          lVar7 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar34 = *(ulong *)(uVar29 + lVar7 * 8);
          uVar32 = uVar32 - 1 & uVar32;
          if (uVar32 != 0) {
            uVar120 = *(uint *)(local_10e8 + lVar7 * 4);
            lVar7 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar35 = *(ulong *)(uVar29 + lVar7 * 8);
            uVar122 = *(uint *)(local_10e8 + lVar7 * 4);
            uVar32 = uVar32 - 1 & uVar32;
            if (uVar32 == 0) {
              if (uVar120 < uVar122) {
                *(ulong *)*pauVar27 = uVar35;
                *(uint *)(*pauVar27 + 8) = uVar122;
                pauVar27 = pauVar27 + 1;
              }
              else {
                *(ulong *)*pauVar27 = uVar34;
                *(uint *)(*pauVar27 + 8) = uVar120;
                pauVar27 = pauVar27 + 1;
                uVar34 = uVar35;
              }
            }
            else {
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar34;
              auVar90 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar120));
              auVar74._8_8_ = 0;
              auVar74._0_8_ = uVar35;
              auVar72 = vpunpcklqdq_avx(auVar74,ZEXT416(uVar122));
              lVar7 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              auVar91._8_8_ = 0;
              auVar91._0_8_ = *(ulong *)(uVar29 + lVar7 * 8);
              auVar104 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_10e8 + lVar7 * 4)));
              auVar58 = vpcmpgtd_avx(auVar72,auVar90);
              uVar32 = uVar32 - 1 & uVar32;
              if (uVar32 == 0) {
                auVar85 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar72,auVar90,auVar85);
                auVar90 = vblendvps_avx(auVar90,auVar72,auVar85);
                auVar72 = vpcmpgtd_avx(auVar104,auVar58);
                auVar85 = vpshufd_avx(auVar72,0xaa);
                auVar72 = vblendvps_avx(auVar104,auVar58,auVar85);
                auVar58 = vblendvps_avx(auVar58,auVar104,auVar85);
                auVar104 = vpcmpgtd_avx(auVar58,auVar90);
                auVar85 = vpshufd_avx(auVar104,0xaa);
                auVar104 = vblendvps_avx(auVar58,auVar90,auVar85);
                auVar90 = vblendvps_avx(auVar90,auVar58,auVar85);
                *pauVar27 = auVar90;
                pauVar27[1] = auVar104;
                uVar34 = auVar72._0_8_;
                pauVar27 = pauVar27 + 2;
              }
              else {
                lVar7 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                auVar108._8_8_ = 0;
                auVar108._0_8_ = *(ulong *)(uVar29 + lVar7 * 8);
                auVar86 = vpunpcklqdq_avx(auVar108,ZEXT416(*(uint *)(local_10e8 + lVar7 * 4)));
                auVar85 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar72,auVar90,auVar85);
                auVar90 = vblendvps_avx(auVar90,auVar72,auVar85);
                auVar72 = vpcmpgtd_avx(auVar86,auVar104);
                auVar85 = vpshufd_avx(auVar72,0xaa);
                auVar72 = vblendvps_avx(auVar86,auVar104,auVar85);
                auVar104 = vblendvps_avx(auVar104,auVar86,auVar85);
                auVar85 = vpcmpgtd_avx(auVar104,auVar90);
                auVar86 = vpshufd_avx(auVar85,0xaa);
                auVar85 = vblendvps_avx(auVar104,auVar90,auVar86);
                auVar90 = vblendvps_avx(auVar90,auVar104,auVar86);
                auVar104 = vpcmpgtd_avx(auVar72,auVar58);
                auVar86 = vpshufd_avx(auVar104,0xaa);
                auVar104 = vblendvps_avx(auVar72,auVar58,auVar86);
                auVar72 = vblendvps_avx(auVar58,auVar72,auVar86);
                auVar58 = vpcmpgtd_avx(auVar85,auVar72);
                auVar86 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar85,auVar72,auVar86);
                auVar72 = vblendvps_avx(auVar72,auVar85,auVar86);
                *pauVar27 = auVar90;
                pauVar27[1] = auVar72;
                pauVar27[2] = auVar58;
                uVar34 = auVar104._0_8_;
                pauVar27 = pauVar27 + 3;
              }
            }
          }
        }
        local_1150 = (ulong)((uint)uVar34 & 0xf) - 8;
        if (local_1150 != 0) {
          uVar34 = uVar34 & 0xfffffffffffffff0;
          local_11a8 = local_11b0->scene;
          local_11a0 = 0;
          do {
            lVar42 = local_11a0 * 0x50;
            pGVar5 = (local_11a8->geometries).items[*(uint *)(uVar34 + 0x30 + lVar42)].ptr;
            fVar46 = (pGVar5->time_range).lower;
            fVar46 = pGVar5->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar46) /
                     ((pGVar5->time_range).upper - fVar46));
            auVar90 = vroundss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),9);
            auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
            auVar98 = vmaxss_avx(ZEXT816(0),auVar90);
            lVar30 = (long)(int)auVar98._0_4_ * 0x38;
            uVar43 = (ulong)*(uint *)(uVar34 + 4 + lVar42);
            lVar7 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar30);
            lVar30 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar30);
            auVar90 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar34 + lVar42) * 4);
            uVar29 = (ulong)*(uint *)(uVar34 + 0x10 + lVar42);
            auVar72 = *(undefined1 (*) [16])(lVar7 + uVar29 * 4);
            uVar35 = (ulong)*(uint *)(uVar34 + 0x20 + lVar42);
            auVar100 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar7 + uVar43 * 4);
            uVar36 = (ulong)*(uint *)(uVar34 + 0x14 + lVar42);
            auVar104 = *(undefined1 (*) [16])(lVar7 + uVar36 * 4);
            uVar37 = (ulong)*(uint *)(uVar34 + 0x24 + lVar42);
            auVar101 = *(undefined1 (*) [16])(lVar7 + uVar37 * 4);
            uVar38 = (ulong)*(uint *)(uVar34 + 8 + lVar42);
            auVar85 = *(undefined1 (*) [16])(lVar7 + uVar38 * 4);
            local_1140 = (ulong)*(uint *)(uVar34 + 0x18 + lVar42);
            auVar86 = *(undefined1 (*) [16])(lVar7 + local_1140 * 4);
            uVar39 = (ulong)*(uint *)(uVar34 + 0x28 + lVar42);
            auVar105 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
            uVar40 = (ulong)*(uint *)(uVar34 + 0xc + lVar42);
            auVar73 = *(undefined1 (*) [16])(lVar7 + uVar40 * 4);
            local_1148 = (ulong)*(uint *)(uVar34 + 0x1c + lVar42);
            auVar87 = *(undefined1 (*) [16])(lVar7 + local_1148 * 4);
            uVar28 = (ulong)*(uint *)(uVar34 + 0x2c + lVar42);
            auVar88 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
            auVar89 = *(undefined1 (*) [16])(lVar30 + (ulong)*(uint *)(uVar34 + lVar42) * 4);
            auVar97 = *(undefined1 (*) [16])(lVar30 + uVar29 * 4);
            fVar46 = fVar46 - auVar98._0_4_;
            auVar98 = vunpcklps_avx(auVar90,auVar85);
            auVar85 = vunpckhps_avx(auVar90,auVar85);
            auVar99 = vunpcklps_avx(auVar58,auVar73);
            auVar58 = vunpckhps_avx(auVar58,auVar73);
            auVar90 = *(undefined1 (*) [16])(lVar30 + uVar43 * 4);
            _local_fa8 = vunpcklps_avx(auVar85,auVar58);
            auVar91 = _local_fa8;
            auVar73 = vunpcklps_avx(auVar98,auVar99);
            auVar85 = vunpckhps_avx(auVar98,auVar99);
            auVar98 = vunpcklps_avx(auVar72,auVar86);
            auVar58 = vunpckhps_avx(auVar72,auVar86);
            auVar86 = vunpcklps_avx(auVar104,auVar87);
            auVar104 = vunpckhps_avx(auVar104,auVar87);
            auVar72 = *(undefined1 (*) [16])(lVar30 + uVar38 * 4);
            auVar87 = vunpcklps_avx(auVar58,auVar104);
            auVar99 = vunpcklps_avx(auVar98,auVar86);
            _local_fb8 = vunpckhps_avx(auVar98,auVar86);
            auVar74 = _local_fb8;
            auVar98 = vunpcklps_avx(auVar100,auVar105);
            auVar104 = vunpckhps_avx(auVar100,auVar105);
            auVar105 = vunpcklps_avx(auVar101,auVar88);
            auVar86 = vunpckhps_avx(auVar101,auVar88);
            auVar58 = *(undefined1 (*) [16])(lVar30 + uVar40 * 4);
            auVar88 = vunpcklps_avx(auVar104,auVar86);
            _local_f98 = vunpcklps_avx(auVar98,auVar105);
            auVar108 = _local_f98;
            _local_1168 = vunpckhps_avx(auVar98,auVar105);
            auVar59 = _local_1168;
            auVar104 = vunpcklps_avx(auVar89,auVar72);
            auVar72 = vunpckhps_avx(auVar89,auVar72);
            auVar86 = vunpcklps_avx(auVar90,auVar58);
            auVar58 = vunpckhps_avx(auVar90,auVar58);
            auVar90 = *(undefined1 (*) [16])(lVar30 + local_1140 * 4);
            auVar105 = vunpcklps_avx(auVar72,auVar58);
            auVar89 = vunpcklps_avx(auVar104,auVar86);
            auVar58 = vunpckhps_avx(auVar104,auVar86);
            auVar86 = vunpcklps_avx(auVar97,auVar90);
            auVar104 = vunpckhps_avx(auVar97,auVar90);
            auVar90 = *(undefined1 (*) [16])(lVar30 + uVar36 * 4);
            auVar72 = *(undefined1 (*) [16])(lVar30 + local_1148 * 4);
            auVar97 = vunpcklps_avx(auVar90,auVar72);
            auVar90 = vunpckhps_avx(auVar90,auVar72);
            auVar98 = vunpcklps_avx(auVar104,auVar90);
            auVar100 = vunpcklps_avx(auVar86,auVar97);
            auVar104 = vunpckhps_avx(auVar86,auVar97);
            auVar90 = *(undefined1 (*) [16])(lVar30 + uVar35 * 4);
            auVar72 = *(undefined1 (*) [16])(lVar30 + uVar39 * 4);
            auVar97 = vunpcklps_avx(auVar90,auVar72);
            auVar86 = vunpckhps_avx(auVar90,auVar72);
            auVar90 = *(undefined1 (*) [16])(lVar30 + uVar37 * 4);
            auVar72 = *(undefined1 (*) [16])(lVar30 + uVar28 * 4);
            auVar101 = vunpcklps_avx(auVar90,auVar72);
            auVar90 = vunpckhps_avx(auVar90,auVar72);
            auVar106 = vunpcklps_avx(auVar86,auVar90);
            auVar107 = vunpcklps_avx(auVar97,auVar101);
            auVar86 = vunpckhps_avx(auVar97,auVar101);
            auVar90 = vshufps_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),0);
            auVar72 = vshufps_avx(ZEXT416((uint)(1.0 - fVar46)),ZEXT416((uint)(1.0 - fVar46)),0);
            fVar46 = auVar90._0_4_;
            fVar55 = auVar90._4_4_;
            fVar56 = auVar90._8_4_;
            fVar57 = auVar90._12_4_;
            fVar113 = auVar72._0_4_;
            fVar135 = auVar72._4_4_;
            fVar136 = auVar72._8_4_;
            fVar137 = auVar72._12_4_;
            auVar109._0_4_ = fVar113 * auVar73._0_4_ + fVar46 * auVar89._0_4_;
            auVar109._4_4_ = fVar135 * auVar73._4_4_ + fVar55 * auVar89._4_4_;
            auVar109._8_4_ = fVar136 * auVar73._8_4_ + fVar56 * auVar89._8_4_;
            auVar109._12_4_ = fVar137 * auVar73._12_4_ + fVar57 * auVar89._12_4_;
            auVar110._0_4_ = fVar113 * auVar85._0_4_ + fVar46 * auVar58._0_4_;
            auVar110._4_4_ = fVar135 * auVar85._4_4_ + fVar55 * auVar58._4_4_;
            auVar110._8_4_ = fVar136 * auVar85._8_4_ + fVar56 * auVar58._8_4_;
            auVar110._12_4_ = fVar137 * auVar85._12_4_ + fVar57 * auVar58._12_4_;
            auVar102._0_4_ = fVar113 * (float)local_fa8._0_4_ + fVar46 * auVar105._0_4_;
            auVar102._4_4_ = fVar135 * (float)local_fa8._4_4_ + fVar55 * auVar105._4_4_;
            auVar102._8_4_ = fVar136 * fStack_fa0 + fVar56 * auVar105._8_4_;
            auVar102._12_4_ = fVar137 * fStack_f9c + fVar57 * auVar105._12_4_;
            auVar60._0_4_ = fVar113 * auVar99._0_4_ + fVar46 * auVar100._0_4_;
            auVar60._4_4_ = fVar135 * auVar99._4_4_ + fVar55 * auVar100._4_4_;
            auVar60._8_4_ = fVar136 * auVar99._8_4_ + fVar56 * auVar100._8_4_;
            auVar60._12_4_ = fVar137 * auVar99._12_4_ + fVar57 * auVar100._12_4_;
            auVar75._0_4_ = fVar113 * (float)local_fb8._0_4_ + fVar46 * auVar104._0_4_;
            auVar75._4_4_ = fVar135 * (float)local_fb8._4_4_ + fVar55 * auVar104._4_4_;
            auVar75._8_4_ = fVar136 * fStack_fb0 + fVar56 * auVar104._8_4_;
            auVar75._12_4_ = fVar137 * fStack_fac + fVar57 * auVar104._12_4_;
            puVar2 = (undefined8 *)(uVar34 + 0x30 + lVar42);
            local_f88 = *puVar2;
            uStack_f80 = puVar2[1];
            puVar2 = (undefined8 *)(uVar34 + 0x40 + lVar42);
            local_11e8._0_4_ = auVar87._0_4_;
            local_11e8._4_4_ = auVar87._4_4_;
            fStack_11e0 = auVar87._8_4_;
            fStack_11dc = auVar87._12_4_;
            auVar114._0_4_ = fVar113 * (float)local_11e8._0_4_ + auVar98._0_4_ * fVar46;
            auVar114._4_4_ = fVar135 * (float)local_11e8._4_4_ + auVar98._4_4_ * fVar55;
            auVar114._8_4_ = fVar136 * fStack_11e0 + auVar98._8_4_ * fVar56;
            auVar114._12_4_ = fVar137 * fStack_11dc + auVar98._12_4_ * fVar57;
            auVar130._0_4_ = fVar113 * (float)local_f98._0_4_ + auVar107._0_4_ * fVar46;
            auVar130._4_4_ = fVar135 * (float)local_f98._4_4_ + auVar107._4_4_ * fVar55;
            auVar130._8_4_ = fVar136 * fStack_f90 + auVar107._8_4_ * fVar56;
            auVar130._12_4_ = fVar137 * fStack_f8c + auVar107._12_4_ * fVar57;
            auVar132._0_4_ = auVar86._0_4_ * fVar46 + fVar113 * (float)local_1168._0_4_;
            auVar132._4_4_ = auVar86._4_4_ * fVar55 + fVar135 * (float)local_1168._4_4_;
            auVar132._8_4_ = auVar86._8_4_ * fVar56 + fVar136 * fStack_1160;
            auVar132._12_4_ = auVar86._12_4_ * fVar57 + fVar137 * fStack_115c;
            local_11f8._0_4_ = auVar88._0_4_;
            local_11f8._4_4_ = auVar88._4_4_;
            fStack_11f0 = auVar88._8_4_;
            fStack_11ec = auVar88._12_4_;
            auVar47._0_4_ = fVar113 * (float)local_11f8._0_4_ + auVar106._0_4_ * fVar46;
            auVar47._4_4_ = fVar135 * (float)local_11f8._4_4_ + auVar106._4_4_ * fVar55;
            auVar47._8_4_ = fVar136 * fStack_11f0 + auVar106._8_4_ * fVar56;
            auVar47._12_4_ = fVar137 * fStack_11ec + auVar106._12_4_ * fVar57;
            local_10f8 = *puVar2;
            uStack_10f0 = puVar2[1];
            auVar90 = vsubps_avx(auVar109,auVar60);
            auVar72 = vsubps_avx(auVar110,auVar75);
            auVar58 = vsubps_avx(auVar102,auVar114);
            auVar104 = vsubps_avx(auVar130,auVar109);
            auVar85 = vsubps_avx(auVar132,auVar110);
            auVar86 = vsubps_avx(auVar47,auVar102);
            fVar57 = auVar86._0_4_;
            fVar117 = auVar72._0_4_;
            auVar48._0_4_ = fVar117 * fVar57;
            fVar8 = auVar86._4_4_;
            fVar119 = auVar72._4_4_;
            auVar48._4_4_ = fVar119 * fVar8;
            fVar13 = auVar86._8_4_;
            fVar121 = auVar72._8_4_;
            auVar48._8_4_ = fVar121 * fVar13;
            fVar18 = auVar86._12_4_;
            fVar123 = auVar72._12_4_;
            auVar48._12_4_ = fVar123 * fVar18;
            fVar113 = auVar85._0_4_;
            fVar125 = auVar58._0_4_;
            auVar61._0_4_ = fVar125 * fVar113;
            fVar9 = auVar85._4_4_;
            fVar127 = auVar58._4_4_;
            auVar61._4_4_ = fVar127 * fVar9;
            fVar14 = auVar85._8_4_;
            fVar128 = auVar58._8_4_;
            auVar61._8_4_ = fVar128 * fVar14;
            fVar19 = auVar85._12_4_;
            fVar129 = auVar58._12_4_;
            auVar61._12_4_ = fVar129 * fVar19;
            local_1058 = vsubps_avx(auVar61,auVar48);
            fVar135 = auVar104._0_4_;
            auVar62._0_4_ = fVar125 * fVar135;
            fVar10 = auVar104._4_4_;
            auVar62._4_4_ = fVar127 * fVar10;
            fVar15 = auVar104._8_4_;
            auVar62._8_4_ = fVar128 * fVar15;
            fVar20 = auVar104._12_4_;
            auVar62._12_4_ = fVar129 * fVar20;
            fVar136 = auVar90._0_4_;
            auVar76._0_4_ = fVar57 * fVar136;
            fVar11 = auVar90._4_4_;
            auVar76._4_4_ = fVar8 * fVar11;
            fVar16 = auVar90._8_4_;
            auVar76._8_4_ = fVar13 * fVar16;
            fVar21 = auVar90._12_4_;
            auVar76._12_4_ = fVar18 * fVar21;
            auVar58 = vsubps_avx(auVar76,auVar62);
            auVar77._0_4_ = fVar113 * fVar136;
            auVar77._4_4_ = fVar9 * fVar11;
            auVar77._8_4_ = fVar14 * fVar16;
            auVar77._12_4_ = fVar19 * fVar21;
            auVar92._0_4_ = fVar117 * fVar135;
            auVar92._4_4_ = fVar119 * fVar10;
            auVar92._8_4_ = fVar121 * fVar15;
            auVar92._12_4_ = fVar123 * fVar20;
            auVar104 = vsubps_avx(auVar92,auVar77);
            uVar26 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar93._4_4_ = uVar26;
            auVar93._0_4_ = uVar26;
            auVar93._8_4_ = uVar26;
            auVar93._12_4_ = uVar26;
            uVar26 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar49._4_4_ = uVar26;
            auVar49._0_4_ = uVar26;
            auVar49._8_4_ = uVar26;
            auVar49._12_4_ = uVar26;
            uVar26 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar138._4_4_ = uVar26;
            auVar138._0_4_ = uVar26;
            auVar138._8_4_ = uVar26;
            auVar138._12_4_ = uVar26;
            fVar46 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_11d8 = vsubps_avx(auVar109,auVar93);
            fVar55 = (ray->super_RayK<1>).dir.field_0.m128[2];
            _local_11e8 = vsubps_avx(auVar110,auVar49);
            _local_11f8 = vsubps_avx(auVar102,auVar138);
            fVar137 = local_11f8._0_4_;
            auVar103._0_4_ = fVar46 * fVar137;
            fVar12 = local_11f8._4_4_;
            auVar103._4_4_ = fVar46 * fVar12;
            fVar17 = local_11f8._8_4_;
            auVar103._8_4_ = fVar46 * fVar17;
            fVar22 = local_11f8._12_4_;
            auVar103._12_4_ = fVar46 * fVar22;
            fVar84 = local_11e8._0_4_;
            auVar139._0_4_ = fVar84 * fVar55;
            fVar94 = local_11e8._4_4_;
            auVar139._4_4_ = fVar94 * fVar55;
            fVar95 = local_11e8._8_4_;
            auVar139._8_4_ = fVar95 * fVar55;
            fVar96 = local_11e8._12_4_;
            auVar139._12_4_ = fVar96 * fVar55;
            auVar72 = vsubps_avx(auVar139,auVar103);
            fVar56 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar71 = local_11d8._0_4_;
            auVar50._0_4_ = fVar71 * fVar55;
            fVar81 = local_11d8._4_4_;
            auVar50._4_4_ = fVar81 * fVar55;
            fVar82 = local_11d8._8_4_;
            auVar50._8_4_ = fVar82 * fVar55;
            fVar83 = local_11d8._12_4_;
            auVar50._12_4_ = fVar83 * fVar55;
            auVar63._0_4_ = fVar137 * fVar56;
            auVar63._4_4_ = fVar12 * fVar56;
            auVar63._8_4_ = fVar17 * fVar56;
            auVar63._12_4_ = fVar22 * fVar56;
            auVar85 = vsubps_avx(auVar63,auVar50);
            auVar64._0_4_ = fVar84 * fVar56;
            auVar64._4_4_ = fVar94 * fVar56;
            auVar64._8_4_ = fVar95 * fVar56;
            auVar64._12_4_ = fVar96 * fVar56;
            auVar78._0_4_ = fVar46 * fVar71;
            auVar78._4_4_ = fVar46 * fVar81;
            auVar78._8_4_ = fVar46 * fVar82;
            auVar78._12_4_ = fVar46 * fVar83;
            auVar86 = vsubps_avx(auVar78,auVar64);
            auVar79._0_4_ =
                 local_1058._0_4_ * fVar56 + fVar46 * auVar58._0_4_ + auVar104._0_4_ * fVar55;
            auVar79._4_4_ =
                 local_1058._4_4_ * fVar56 + fVar46 * auVar58._4_4_ + auVar104._4_4_ * fVar55;
            auVar79._8_4_ =
                 local_1058._8_4_ * fVar56 + fVar46 * auVar58._8_4_ + auVar104._8_4_ * fVar55;
            auVar79._12_4_ =
                 local_1058._12_4_ * fVar56 + fVar46 * auVar58._12_4_ + auVar104._12_4_ * fVar55;
            auVar65._8_8_ = 0x8000000080000000;
            auVar65._0_8_ = 0x8000000080000000;
            auVar90 = vandps_avx(auVar79,auVar65);
            uVar32 = auVar90._0_4_;
            local_10e8._0_4_ =
                 (float)(uVar32 ^ (uint)(fVar135 * auVar72._0_4_ +
                                        fVar113 * auVar85._0_4_ + fVar57 * auVar86._0_4_));
            uVar120 = auVar90._4_4_;
            local_10e8._4_4_ =
                 (float)(uVar120 ^
                        (uint)(fVar10 * auVar72._4_4_ +
                              fVar9 * auVar85._4_4_ + fVar8 * auVar86._4_4_));
            uVar122 = auVar90._8_4_;
            local_10e8._8_4_ =
                 (float)(uVar122 ^
                        (uint)(fVar15 * auVar72._8_4_ +
                              fVar14 * auVar85._8_4_ + fVar13 * auVar86._8_4_));
            uVar124 = auVar90._12_4_;
            local_10e8._12_4_ =
                 (float)(uVar124 ^
                        (uint)(fVar20 * auVar72._12_4_ +
                              fVar19 * auVar85._12_4_ + fVar18 * auVar86._12_4_));
            local_10d8._0_4_ =
                 (float)(uVar32 ^ (uint)(auVar72._0_4_ * fVar136 +
                                        fVar117 * auVar85._0_4_ + fVar125 * auVar86._0_4_));
            local_10d8._4_4_ =
                 (float)(uVar120 ^
                        (uint)(auVar72._4_4_ * fVar11 +
                              fVar119 * auVar85._4_4_ + fVar127 * auVar86._4_4_));
            local_10d8._8_4_ =
                 (float)(uVar122 ^
                        (uint)(auVar72._8_4_ * fVar16 +
                              fVar121 * auVar85._8_4_ + fVar128 * auVar86._8_4_));
            local_10d8._12_4_ =
                 (float)(uVar124 ^
                        (uint)(auVar72._12_4_ * fVar21 +
                              fVar123 * auVar85._12_4_ + fVar129 * auVar86._12_4_));
            auVar85 = ZEXT816(0) << 0x20;
            auVar90 = vcmpps_avx(local_10e8,auVar85,5);
            auVar72 = vcmpps_avx(local_10d8,auVar85,5);
            auVar90 = vandps_avx(auVar90,auVar72);
            auVar66._8_4_ = 0x7fffffff;
            auVar66._0_8_ = 0x7fffffff7fffffff;
            auVar66._12_4_ = 0x7fffffff;
            local_10b8 = vandps_avx(auVar79,auVar66);
            auVar72 = vcmpps_avx(auVar85,auVar79,4);
            auVar90 = vandps_avx(auVar90,auVar72);
            auVar67._0_4_ = local_10e8._0_4_ + local_10d8._0_4_;
            auVar67._4_4_ = local_10e8._4_4_ + local_10d8._4_4_;
            auVar67._8_4_ = local_10e8._8_4_ + local_10d8._8_4_;
            auVar67._12_4_ = local_10e8._12_4_ + local_10d8._12_4_;
            auVar72 = vcmpps_avx(auVar67,local_10b8,2);
            auVar90 = vandps_avx(auVar90,auVar72);
            auVar23._8_8_ = uStack_1100;
            auVar23._0_8_ = local_1108;
            auVar23 = auVar23 & auVar90;
            if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar23[0xf] < '\0') {
              auVar24._8_8_ = uStack_1100;
              auVar24._0_8_ = local_1108;
              auVar90 = vandps_avx(auVar90,auVar24);
              local_10c8._0_4_ =
                   (float)(uVar32 ^ (uint)(local_1058._0_4_ * fVar71 +
                                          fVar84 * auVar58._0_4_ + fVar137 * auVar104._0_4_));
              local_10c8._4_4_ =
                   (float)(uVar120 ^
                          (uint)(local_1058._4_4_ * fVar81 +
                                fVar94 * auVar58._4_4_ + fVar12 * auVar104._4_4_));
              local_10c8._8_4_ =
                   (float)(uVar122 ^
                          (uint)(local_1058._8_4_ * fVar82 +
                                fVar95 * auVar58._8_4_ + fVar17 * auVar104._8_4_));
              local_10c8._12_4_ =
                   (float)(uVar124 ^
                          (uint)(local_1058._12_4_ * fVar83 +
                                fVar96 * auVar58._12_4_ + fVar22 * auVar104._12_4_));
              fVar46 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar55 = local_10b8._0_4_;
              auVar51._0_4_ = fVar55 * fVar46;
              fVar56 = local_10b8._4_4_;
              auVar51._4_4_ = fVar56 * fVar46;
              fVar57 = local_10b8._8_4_;
              auVar51._8_4_ = fVar57 * fVar46;
              fVar113 = local_10b8._12_4_;
              auVar51._12_4_ = fVar113 * fVar46;
              auVar72 = vcmpps_avx(auVar51,local_10c8,1);
              fVar46 = (ray->super_RayK<1>).tfar;
              auVar68._0_4_ = fVar55 * fVar46;
              auVar68._4_4_ = fVar56 * fVar46;
              auVar68._8_4_ = fVar57 * fVar46;
              auVar68._12_4_ = fVar113 * fVar46;
              auVar85 = vcmpps_avx(local_10c8,auVar68,2);
              auVar72 = vandps_avx(auVar85,auVar72);
              auVar85 = auVar90 & auVar72;
              if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar85[0xf] < '\0') {
                auVar115._0_4_ = (ray->super_RayK<1>).tfar;
                auVar115._4_4_ = (ray->super_RayK<1>).mask;
                auVar115._8_4_ = (ray->super_RayK<1>).id;
                auVar115._12_4_ = (ray->super_RayK<1>).flags;
                auVar90 = vandps_avx(auVar90,auVar72);
                local_1098 = auVar90;
                local_1248 = auVar58._0_8_;
                uStack_1240 = auVar58._8_8_;
                local_1048 = local_1248;
                uStack_1040 = uStack_1240;
                local_1228 = auVar104._0_8_;
                uStack_1220 = auVar104._8_8_;
                local_1038 = local_1228;
                uStack_1030 = uStack_1220;
                local_11c8 = auVar90;
                auVar72 = vrcpps_avx(local_10b8);
                fVar46 = auVar72._0_4_;
                auVar69._0_4_ = fVar55 * fVar46;
                fVar55 = auVar72._4_4_;
                auVar69._4_4_ = fVar56 * fVar55;
                fVar56 = auVar72._8_4_;
                auVar69._8_4_ = fVar57 * fVar56;
                fVar57 = auVar72._12_4_;
                auVar69._12_4_ = fVar113 * fVar57;
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = 0x3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar72 = vsubps_avx(auVar80,auVar69);
                fVar46 = fVar46 + fVar46 * auVar72._0_4_;
                fVar55 = fVar55 + fVar55 * auVar72._4_4_;
                fVar56 = fVar56 + fVar56 * auVar72._8_4_;
                fVar57 = fVar57 + fVar57 * auVar72._12_4_;
                auVar111._0_4_ = fVar46 * local_10c8._0_4_;
                auVar111._4_4_ = fVar55 * local_10c8._4_4_;
                auVar111._8_4_ = fVar56 * local_10c8._8_4_;
                auVar111._12_4_ = fVar57 * local_10c8._12_4_;
                local_1068 = auVar111;
                local_1088[0] = fVar46 * local_10e8._0_4_;
                local_1088[1] = fVar55 * local_10e8._4_4_;
                local_1088[2] = fVar56 * local_10e8._8_4_;
                local_1088[3] = fVar57 * local_10e8._12_4_;
                local_1078[0] = fVar46 * local_10d8._0_4_;
                local_1078[1] = fVar55 * local_10d8._4_4_;
                local_1078[2] = fVar56 * local_10d8._8_4_;
                local_1078[3] = fVar57 * local_10d8._12_4_;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar72 = vblendvps_avx(auVar52,auVar111,auVar90);
                auVar58 = vshufps_avx(auVar72,auVar72,0xb1);
                auVar58 = vminps_avx(auVar58,auVar72);
                auVar104 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar104,auVar58);
                auVar72 = vcmpps_avx(auVar72,auVar58,0);
                auVar58 = auVar90 & auVar72;
                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar58[0xf] < '\0') {
                  auVar90 = vandps_avx(auVar72,auVar90);
                }
                uVar32 = vextractps_avx(auVar115,1);
                uVar26 = vmovmskps_avx(auVar90);
                uVar28 = CONCAT44((int)((ulong)local_11a0 >> 0x20),uVar26);
                piVar33 = (int *)0x0;
                _local_1168 = auVar59;
                _local_fb8 = auVar74;
                _local_fa8 = auVar91;
                _local_f98 = auVar108;
                if (uVar28 != 0) {
                  for (; (uVar28 >> (long)piVar33 & 1) == 0; piVar33 = (int *)((long)piVar33 + 1)) {
                  }
                }
                do {
                  uVar120 = *(uint *)((long)&local_f88 + (long)piVar33 * 4);
                  pGVar5 = (local_11a8->geometries).items[uVar120].ptr;
                  if ((pGVar5->mask & uVar32) == 0) {
                    *(undefined4 *)(local_11c8 + (long)piVar33 * 4) = 0;
                  }
                  else {
                    pRVar6 = local_11b0->args;
                    if (pRVar6->filter == (RTCFilterFunctionN)0x0) {
                      pRVar31 = local_11b0->user;
                      if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar46 = local_1088[(long)piVar33];
                        fVar55 = local_1078[(long)piVar33];
                        (ray->super_RayK<1>).tfar = *(float *)(local_1068 + (long)piVar33 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1058 + (long)piVar33 * 4);
                        (ray->Ng).field_0.field_0.y =
                             *(float *)((long)&local_1048 + (long)piVar33 * 4);
                        (ray->Ng).field_0.field_0.z =
                             *(float *)((long)&local_1038 + (long)piVar33 * 4);
                        ray->u = fVar46;
                        ray->v = fVar55;
                        ray->primID = *(uint *)((long)&local_10f8 + (long)piVar33 * 4);
                        ray->geomID = uVar120;
                        ray->instID[0] = pRVar31->instID[0];
                        ray->instPrimID[0] = pRVar31->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar31 = local_11b0->user;
                    }
                    local_1138 = *(undefined4 *)(local_1058 + (long)piVar33 * 4);
                    local_1134 = *(undefined4 *)((long)&local_1048 + (long)piVar33 * 4);
                    local_1130 = *(undefined4 *)((long)&local_1038 + (long)piVar33 * 4);
                    local_112c = local_1088[(long)piVar33];
                    local_1128 = local_1078[(long)piVar33];
                    local_1124 = *(undefined4 *)((long)&local_10f8 + (long)piVar33 * 4);
                    local_1120 = uVar120;
                    local_111c = pRVar31->instID[0];
                    local_1118 = pRVar31->instPrimID[0];
                    local_11d8._0_8_ = piVar33;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1068 + (long)piVar33 * 4);
                    local_11fc = -1;
                    local_1198.valid = &local_11fc;
                    local_1198.geometryUserPtr = pGVar5->userPtr;
                    local_1198.context = pRVar31;
                    local_1198.ray = (RTCRayN *)ray;
                    local_1198.hit = (RTCHitN *)&local_1138;
                    local_1198.N = 1;
                    local_11e8 = (undefined1  [8])pGVar5;
                    if (((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar5->intersectionFilterN)(&local_1198), *local_1198.valid != 0)) &&
                       ((pRVar6->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)((long)local_11e8 + 0x3e) & 0x40) == 0)) ||
                         ((*pRVar6->filter)(&local_1198), *local_1198.valid != 0)))))) {
                      (((Vec3f *)((long)local_1198.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1198.hit;
                      (((Vec3f *)((long)local_1198.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1198.hit + 4);
                      (((Vec3f *)((long)local_1198.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1198.hit + 8);
                      *(float *)((long)local_1198.ray + 0x3c) = *(float *)(local_1198.hit + 0xc);
                      *(float *)((long)local_1198.ray + 0x40) = *(float *)(local_1198.hit + 0x10);
                      *(float *)((long)local_1198.ray + 0x44) = *(float *)(local_1198.hit + 0x14);
                      *(float *)((long)local_1198.ray + 0x48) = *(float *)(local_1198.hit + 0x18);
                      *(float *)((long)local_1198.ray + 0x4c) = *(float *)(local_1198.hit + 0x1c);
                      *(float *)((long)local_1198.ray + 0x50) = *(float *)(local_1198.hit + 0x20);
                    }
                    else {
                      local_1248._0_4_ = auVar115._0_4_;
                      (ray->super_RayK<1>).tfar = (float)local_1248;
                    }
                    *(undefined4 *)(local_11c8 + local_11d8._0_8_ * 4) = 0;
                    fVar46 = (ray->super_RayK<1>).tfar;
                    auVar53._4_4_ = fVar46;
                    auVar53._0_4_ = fVar46;
                    auVar53._8_4_ = fVar46;
                    auVar53._12_4_ = fVar46;
                    auVar90 = vcmpps_avx(auVar111,auVar53,2);
                    local_11c8 = vandps_avx(auVar90,local_11c8);
                    auVar115._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar115._4_4_ = (ray->super_RayK<1>).mask;
                    auVar115._8_4_ = (ray->super_RayK<1>).id;
                    auVar115._12_4_ = (ray->super_RayK<1>).flags;
                    uVar32 = vextractps_avx(auVar115,1);
                  }
                  if ((((local_11c8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_11c8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_11c8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_11c8[0xf]) break;
                  BVHNIntersector1<4,16777232,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_1198);
                  piVar33 = local_1198.valid;
                } while( true );
              }
            }
            local_11a0 = local_11a0 + 1;
          } while (local_11a0 != local_1150);
        }
        fVar46 = (ray->super_RayK<1>).tfar;
        auVar54 = ZEXT1664(CONCAT412(fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46))));
        auVar70 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar112 = ZEXT1664(local_fc8);
        auVar116 = ZEXT1664(local_fd8);
        auVar118 = ZEXT1664(local_fe8);
        auVar126 = ZEXT1664(local_ff8);
        auVar131 = ZEXT1664(local_1008);
        auVar133 = ZEXT1664(local_1018);
        auVar134 = ZEXT1664(local_1028);
        uVar28 = local_1158;
      }
    } while (pauVar27 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }